

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EM.cpp
# Opt level: O0

void __thiscall EM::em_alg(EM *this,int cl)

{
  allocator<double> *paVar1;
  allocator<std::vector<double,_std::allocator<double>_>_> *paVar2;
  value_type vVar3;
  double dVar4;
  initializer_list<double> __l;
  initializer_list<double> __l_00;
  initializer_list<double> __l_01;
  initializer_list<double> __l_02;
  int iVar5;
  reference pvVar6;
  reference pvVar7;
  reference pvVar8;
  reference pvVar9;
  reference pvVar10;
  reference pvVar11;
  reference pvVar12;
  longdouble in_ST0;
  longdouble lVar13;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble lVar14;
  double dVar15;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double dVar16;
  double dVar17;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  vector<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
  local_448;
  int local_42c;
  double dStack_428;
  int i_8;
  double local_420;
  int local_418;
  allocator<std::vector<double,_std::allocator<double>_>_> local_411;
  int k_2;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  r;
  undefined1 local_3f0 [8];
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  l_1;
  int i_7;
  int k_1;
  int j_3;
  int j_2;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_3b0;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_398;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_380;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_368;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_350;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_338;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_320;
  value_type local_308;
  double sigma;
  int local_2f8;
  allocator<std::vector<double,_std::allocator<double>_>_> local_2f1;
  int k;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  l;
  int local_2d0;
  int j_1;
  int i_6;
  undefined8 local_2c0;
  iterator local_2b8;
  size_type local_2b0;
  vector<double,_std::allocator<double>_> local_2a8;
  allocator<double> local_289;
  double local_288 [2];
  iterator local_278;
  size_type local_270;
  vector<double,_std::allocator<double>_> local_268;
  int local_250;
  allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
  local_249;
  int i_5;
  vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  Rtmp;
  value_type_conflict local_228;
  undefined1 local_220 [8];
  vector<double,_std::allocator<double>_> Wtmp;
  value_type_conflict local_200;
  vector<double,_std::allocator<double>_> local_1f8;
  undefined1 local_1e0 [8];
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  Ctmp;
  longdouble sumpi;
  longdouble llh2;
  longdouble llh;
  allocator<std::vector<long_double,_std::allocator<long_double>_>_> local_18a;
  allocator<long_double> local_189;
  value_type_conflict3 local_188;
  vector<long_double,_std::allocator<long_double>_> local_170;
  undefined1 local_158 [8];
  vector<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
  X;
  int i_4;
  vector<double,_std::allocator<double>_> W;
  double local_118 [2];
  iterator local_108;
  size_type local_100;
  vector<double,_std::allocator<double>_> local_f8;
  allocator<double> local_d9;
  double local_d8 [2];
  iterator local_c8;
  size_type local_c0;
  vector<double,_std::allocator<double>_> local_b8;
  int local_a0;
  allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
  local_99;
  int i_3;
  vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  R;
  int j;
  int i_2;
  int i_1;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  C;
  int i;
  allocator<std::vector<double,_std::allocator<double>_>_> local_41;
  undefined1 local_40 [8];
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  Y;
  int Q;
  double e;
  int dim;
  int cl_local;
  EM *this_local;
  
  Y.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  iVar5 = this->points_nmb;
  std::allocator<std::vector<double,_std::allocator<double>_>_>::allocator(&local_41);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)local_40,(long)iVar5,&local_41);
  std::allocator<std::vector<double,_std::allocator<double>_>_>::~allocator(&local_41);
  for (C.
       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
      (int)C.
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage < this->points_nmb;
      C.
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
           (int)C.
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) {
    pvVar6 = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           *)local_40,
                          (long)(int)C.
                                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
    pvVar7 = std::vector<Point,_std::allocator<Point>_>::operator[]
                       (&(this->f).all_points,
                        (long)(int)C.
                                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::vector<double,_std::allocator<double>_>::push_back(pvVar6,&pvVar7->x);
    pvVar6 = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           *)local_40,
                          (long)(int)C.
                                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
    pvVar7 = std::vector<Point,_std::allocator<Point>_>::operator[]
                       (&(this->f).all_points,
                        (long)(int)C.
                                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::vector<double,_std::allocator<double>_>::push_back(pvVar6,&pvVar7->y);
  }
  std::allocator<std::vector<double,_std::allocator<double>_>_>::allocator
            ((allocator<std::vector<double,_std::allocator<double>_>_> *)((long)&i_2 + 3));
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)&i_1,2,(allocator<std::vector<double,_std::allocator<double>_>_> *)((long)&i_2 + 3));
  std::allocator<std::vector<double,_std::allocator<double>_>_>::~allocator
            ((allocator<std::vector<double,_std::allocator<double>_>_> *)((long)&i_2 + 3));
  for (j = 0; j < cl; j = j + 1) {
    for (R.
         super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
        R.
        super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ < 2;
        R.
        super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
             R.
             super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
      pvVar6 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             *)&i_1,(long)R.
                                          super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
      std::vector<double,_std::allocator<double>_>::resize(pvVar6,(long)cl);
      for (R.
           super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
          (int)R.
               super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage < cl;
          R.
          super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
               (int)R.
                    super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) {
        iVar5 = rand();
        pvVar6 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               *)&i_1,(long)R.
                                            super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_
                             );
        pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                           (pvVar6,(long)(int)R.
                                              super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
        *pvVar8 = (double)(iVar5 % 1000) / 1000.0;
      }
    }
  }
  std::
  allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
  ::allocator(&local_99);
  std::
  vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  ::vector((vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
            *)&i_3,(long)cl,&local_99);
  std::
  allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
  ::~allocator(&local_99);
  for (local_a0 = 0; local_a0 < cl; local_a0 = local_a0 + 1) {
    pvVar9 = std::
             vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
             ::operator[]((vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                           *)&i_3,(long)local_a0);
    local_d8[0] = 1.0;
    local_d8[1] = 0.0;
    local_c8 = local_d8;
    local_c0 = 2;
    std::allocator<double>::allocator(&local_d9);
    __l_02._M_len = local_c0;
    __l_02._M_array = local_c8;
    std::vector<double,_std::allocator<double>_>::vector(&local_b8,__l_02,&local_d9);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::push_back(pvVar9,&local_b8);
    std::vector<double,_std::allocator<double>_>::~vector(&local_b8);
    std::allocator<double>::~allocator(&local_d9);
    pvVar9 = std::
             vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
             ::operator[]((vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                           *)&i_3,(long)local_a0);
    local_118[0] = 0.0;
    local_118[1] = 1.0;
    local_108 = local_118;
    local_100 = 2;
    paVar1 = (allocator<double> *)
             ((long)&W.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7);
    std::allocator<double>::allocator(paVar1);
    __l_01._M_len = local_100;
    __l_01._M_array = local_108;
    std::vector<double,_std::allocator<double>_>::vector(&local_f8,__l_01,paVar1);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::push_back(pvVar9,&local_f8);
    std::vector<double,_std::allocator<double>_>::~vector(&local_f8);
    std::allocator<double>::~allocator
              ((allocator<double> *)
               ((long)&W.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
  }
  paVar1 = (allocator<double> *)
           ((long)&X.
                   super__Vector_base<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<double>::allocator(paVar1);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&i_4,(long)cl,paVar1);
  std::allocator<double>::~allocator
            ((allocator<double> *)
             ((long)&X.
                     super__Vector_base<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  for (X.
       super__Vector_base<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
      (int)X.
           super__Vector_base<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage < cl;
      X.
      super__Vector_base<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
           (int)X.
                super__Vector_base<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) {
    pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)&i_4,
                        (long)(int)X.
                                   super__Vector_base<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
    *pvVar8 = 1.0 / (double)cl;
  }
  iVar5 = this->points_nmb;
  local_188._0_10_ = (longdouble)0;
  std::allocator<long_double>::allocator(&local_189);
  std::vector<long_double,_std::allocator<long_double>_>::vector
            (&local_170,(long)cl,&local_188,&local_189);
  std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>::allocator(&local_18a);
  std::
  vector<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
  ::vector((vector<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
            *)local_158,(long)iVar5,&local_170,&local_18a);
  std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>::~allocator(&local_18a);
  std::vector<long_double,_std::allocator<long_double>_>::~vector(&local_170);
  std::allocator<long_double>::~allocator(&local_189);
  unique0x00076c00 = (longdouble)0;
  dVar15 = 2.1;
  while (lVar13 = in_ST5, std::fabs(dVar15),
        (longdouble)0.1 <= in_ST0 &&
        Y.
        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ < 0x32) {
    local_200 = 0.0;
    paVar1 = (allocator<double> *)
             ((long)&Wtmp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7);
    lVar14 = lVar13;
    std::allocator<double>::allocator(paVar1);
    std::vector<double,_std::allocator<double>_>::vector(&local_1f8,(long)cl,&local_200,paVar1);
    paVar2 = (allocator<std::vector<double,_std::allocator<double>_>_> *)
             ((long)&Wtmp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 6);
    std::allocator<std::vector<double,_std::allocator<double>_>_>::allocator(paVar2);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              *)local_1e0,2,&local_1f8,paVar2);
    std::allocator<std::vector<double,_std::allocator<double>_>_>::~allocator
              ((allocator<std::vector<double,_std::allocator<double>_>_> *)
               ((long)&Wtmp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 6));
    std::vector<double,_std::allocator<double>_>::~vector(&local_1f8);
    std::allocator<double>::~allocator
              ((allocator<double> *)
               ((long)&Wtmp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
    local_228 = 0.0;
    paVar1 = (allocator<double> *)
             ((long)&Rtmp.
                     super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
    std::allocator<double>::allocator(paVar1);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)local_220,(long)cl,&local_228,paVar1);
    std::allocator<double>::~allocator
              ((allocator<double> *)
               ((long)&Rtmp.
                       super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    Y.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
         Y.
         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
    std::
    allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
    ::allocator(&local_249);
    std::
    vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
    ::vector((vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
              *)&i_5,(long)cl,&local_249);
    std::
    allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
    ::~allocator(&local_249);
    in_ST0 = in_ST1;
    in_ST1 = in_ST2;
    in_ST2 = in_ST3;
    in_ST3 = in_ST4;
    in_ST4 = in_ST5;
    in_ST5 = lVar13;
    dVar15 = extraout_XMM0_Qa;
    for (local_250 = 0; local_250 < cl; local_250 = local_250 + 1) {
      pvVar9 = std::
               vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
               ::operator[]((vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                             *)&i_5,(long)local_250);
      local_288[0] = 0.0;
      local_288[1] = 0.0;
      local_278 = local_288;
      local_270 = 2;
      std::allocator<double>::allocator(&local_289);
      __l_00._M_len = local_270;
      __l_00._M_array = local_278;
      std::vector<double,_std::allocator<double>_>::vector(&local_268,__l_00,&local_289);
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::push_back(pvVar9,&local_268);
      std::vector<double,_std::allocator<double>_>::~vector(&local_268);
      std::allocator<double>::~allocator(&local_289);
      pvVar9 = std::
               vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
               ::operator[]((vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                             *)&i_5,(long)local_250);
      _i_6 = 0.0;
      local_2c0 = 0;
      local_2b8 = (iterator)&i_6;
      local_2b0 = 2;
      std::allocator<double>::allocator((allocator<double> *)((long)&j_1 + 3));
      __l._M_len = local_2b0;
      __l._M_array = local_2b8;
      std::vector<double,_std::allocator<double>_>::vector
                (&local_2a8,__l,(allocator<double> *)((long)&j_1 + 3));
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::push_back(pvVar9,&local_2a8);
      std::vector<double,_std::allocator<double>_>::~vector(&local_2a8);
      std::allocator<double>::~allocator((allocator<double> *)((long)&j_1 + 3));
      dVar15 = extraout_XMM0_Qa_00;
    }
    for (local_2d0 = 0; local_2d0 < this->points_nmb; local_2d0 = local_2d0 + 1) {
      unique0x00076c00 = (longdouble)0;
      for (l.
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
          l.
          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ < cl;
          l.
          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
               l.
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
        std::allocator<std::vector<double,_std::allocator<double>_>_>::allocator(&local_2f1);
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  *)&k,2,&local_2f1);
        std::allocator<std::vector<double,_std::allocator<double>_>_>::~allocator(&local_2f1);
        lVar13 = in_ST0;
        in_ST0 = in_ST1;
        in_ST1 = in_ST2;
        in_ST2 = in_ST3;
        in_ST3 = in_ST4;
        in_ST4 = in_ST5;
        for (local_2f8 = 0; local_2f8 < 2; local_2f8 = local_2f8 + 1) {
          pvVar6 = std::
                   vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                 *)&k,(long)local_2f8);
          pvVar10 = std::
                    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                  *)local_40,(long)local_2d0);
          pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](pvVar10,(long)local_2f8)
          ;
          dVar15 = *pvVar8;
          pvVar10 = std::
                    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                  *)&i_1,(long)local_2f8);
          pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                             (pvVar10,(long)l.
                                            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_
                             );
          sigma = dVar15 - *pvVar8;
          std::vector<double,_std::allocator<double>_>::push_back(pvVar6,&sigma);
        }
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::vector(&local_368,
                 (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  *)&k);
        matrix_transporation(&local_350,this,&local_368);
        pvVar9 = std::
                 vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                 ::operator[]((vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                               *)&i_3,(long)l.
                                            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_
                             );
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::vector(&local_398,pvVar9);
        matrix_reversal(&local_380,this,&local_398);
        matrix_composition(&local_338,this,&local_350,&local_380);
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::vector(&local_3b0,
                 (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  *)&k);
        matrix_composition(&local_320,this,&local_338,&local_3b0);
        pvVar6 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[](&local_320,0);
        pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](pvVar6,0);
        vVar3 = *pvVar8;
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::~vector(&local_320);
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::~vector(&local_3b0);
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::~vector(&local_338);
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::~vector(&local_380);
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::~vector(&local_398);
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::~vector(&local_350);
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::~vector(&local_368);
        local_308 = vVar3;
        pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)&i_4,
                            (long)l.
                                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
        dVar15 = *pvVar8;
        in_ST5 = in_ST4;
        expl();
        dVar16 = sqrt(6.2831853);
        pvVar9 = std::
                 vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                 ::operator[]((vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                               *)&i_3,(long)l.
                                            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_
                             );
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  *)&j_3,pvVar9);
        dVar17 = determinat(this,(vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                  *)&j_3);
        dVar17 = sqrt(dVar17);
        pvVar11 = std::
                  vector<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
                  ::operator[]((vector<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
                                *)local_158,(long)local_2d0);
        pvVar12 = std::vector<long_double,_std::allocator<long_double>_>::operator[]
                            (pvVar11,(long)l.
                                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_)
        ;
        *(longdouble *)pvVar12 =
             (((longdouble)dVar15 * lVar13) / (longdouble)dVar16) / (longdouble)dVar17;
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   *)&j_3);
        pvVar11 = std::
                  vector<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
                  ::operator[]((vector<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
                                *)local_158,(long)local_2d0);
        pvVar12 = std::vector<long_double,_std::allocator<long_double>_>::operator[]
                            (pvVar11,(long)l.
                                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_)
        ;
        register0x00001110 = stack0xfffffffffffffe38 + *(longdouble *)pvVar12;
        lVar14 = in_ST5;
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   *)&k);
        dVar15 = extraout_XMM0_Qa_01;
      }
      in_ST0 = in_ST1;
      in_ST1 = in_ST2;
      in_ST2 = in_ST3;
      in_ST3 = in_ST4;
      in_ST4 = in_ST5;
      in_ST5 = lVar14;
      for (k_1 = 0; lVar13 = stack0xfffffffffffffe38, k_1 < cl; k_1 = k_1 + 1) {
        pvVar11 = std::
                  vector<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
                  ::operator[]((vector<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
                                *)local_158,(long)local_2d0);
        pvVar12 = std::vector<long_double,_std::allocator<long_double>_>::operator[]
                            (pvVar11,(long)k_1);
        *(longdouble *)pvVar12 = *(longdouble *)pvVar12 / lVar13;
        pvVar11 = std::
                  vector<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
                  ::operator[]((vector<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
                                *)local_158,(long)local_2d0);
        pvVar12 = std::vector<long_double,_std::allocator<long_double>_>::operator[]
                            (pvVar11,(long)k_1);
        lVar13 = *(longdouble *)pvVar12;
        pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)local_220,(long)k_1);
        *pvVar8 = (double)((longdouble)*pvVar8 + lVar13);
        pvVar6 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               *)local_40,(long)local_2d0);
        pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](pvVar6,0);
        dVar15 = *pvVar8;
        pvVar11 = std::
                  vector<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
                  ::operator[]((vector<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
                                *)local_158,(long)local_2d0);
        pvVar12 = std::vector<long_double,_std::allocator<long_double>_>::operator[]
                            (pvVar11,(long)k_1);
        lVar13 = *(longdouble *)pvVar12;
        pvVar6 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               *)local_1e0,0);
        pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](pvVar6,(long)k_1);
        *pvVar8 = (double)((longdouble)*pvVar8 + (longdouble)dVar15 * lVar13);
        pvVar6 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               *)local_40,(long)local_2d0);
        pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](pvVar6,1);
        dVar15 = *pvVar8;
        pvVar11 = std::
                  vector<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
                  ::operator[]((vector<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
                                *)local_158,(long)local_2d0);
        pvVar12 = std::vector<long_double,_std::allocator<long_double>_>::operator[]
                            (pvVar11,(long)k_1);
        lVar13 = *(longdouble *)pvVar12;
        pvVar6 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               *)local_1e0,1);
        pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](pvVar6,(long)k_1);
        dVar15 = (double)((longdouble)*pvVar8 + (longdouble)dVar15 * lVar13);
        *pvVar8 = dVar15;
        in_ST4 = in_ST3;
        in_ST5 = in_ST3;
      }
      dVar15 = std::log(dVar15);
      lVar14 = in_ST5;
    }
    for (i_7 = 0; i_7 < cl; i_7 = i_7 + 1) {
      for (l_1.
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
          l_1.
          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ < 2;
          l_1.
          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
               l_1.
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
        pvVar6 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               *)local_1e0,
                              (long)l_1.
                                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
        pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](pvVar6,(long)i_7);
        dVar15 = *pvVar8;
        pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)local_220,(long)i_7);
        dVar16 = *pvVar8;
        pvVar6 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               *)&i_1,(long)l_1.
                                            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_
                             );
        pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](pvVar6,(long)i_7);
        *pvVar8 = dVar15 / dVar16;
      }
      for (l_1.
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
          (int)l_1.
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage < this->points_nmb;
          l_1.
          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
               (int)l_1.
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) {
        paVar2 = (allocator<std::vector<double,_std::allocator<double>_>_> *)
                 ((long)&r.
                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
        std::allocator<std::vector<double,_std::allocator<double>_>_>::allocator(paVar2);
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  *)local_3f0,2,paVar2);
        std::allocator<std::vector<double,_std::allocator<double>_>_>::~allocator
                  ((allocator<std::vector<double,_std::allocator<double>_>_> *)
                   ((long)&r.
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        std::allocator<std::vector<double,_std::allocator<double>_>_>::allocator(&local_411);
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  *)&k_2,2,&local_411);
        std::allocator<std::vector<double,_std::allocator<double>_>_>::~allocator(&local_411);
        for (local_418 = 0; local_418 < 2; local_418 = local_418 + 1) {
          pvVar6 = std::
                   vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                 *)local_3f0,(long)local_418);
          pvVar10 = std::
                    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                  *)local_40,
                                 (long)(int)l_1.
                                            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
          pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](pvVar10,(long)local_418)
          ;
          dVar15 = *pvVar8;
          pvVar10 = std::
                    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                  *)&i_1,(long)local_418);
          pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](pvVar10,(long)i_7);
          dVar16 = *pvVar8;
          pvVar11 = std::
                    vector<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
                    ::operator[]((vector<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
                                  *)local_158,
                                 (long)(int)l_1.
                                            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
          pvVar12 = std::vector<long_double,_std::allocator<long_double>_>::operator[]
                              (pvVar11,(long)i_7);
          local_420 = (double)(*(longdouble *)pvVar12 * (longdouble)(dVar15 - dVar16));
          std::vector<double,_std::allocator<double>_>::push_back(pvVar6,&local_420);
          pvVar6 = std::
                   vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                 *)&k_2,(long)local_418);
          pvVar10 = std::
                    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                  *)local_40,
                                 (long)(int)l_1.
                                            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
          pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](pvVar10,(long)local_418)
          ;
          dVar15 = *pvVar8;
          pvVar10 = std::
                    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                  *)&i_1,(long)local_418);
          pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](pvVar10,(long)i_7);
          dStack_428 = dVar15 - *pvVar8;
          std::vector<double,_std::allocator<double>_>::push_back(pvVar6,&stack0xfffffffffffffbd8);
        }
        pvVar6 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               *)local_40,
                              (long)(int)l_1.
                                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
        pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](pvVar6,0);
        dVar15 = *pvVar8;
        pvVar6 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               *)&i_1,0);
        pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](pvVar6,(long)i_7);
        dVar16 = *pvVar8;
        pvVar6 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               *)local_40,
                              (long)(int)l_1.
                                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
        pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](pvVar6,0);
        dVar17 = *pvVar8;
        pvVar6 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               *)&i_1,0);
        pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](pvVar6,(long)i_7);
        dVar4 = *pvVar8;
        pvVar11 = std::
                  vector<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
                  ::operator[]((vector<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
                                *)local_158,
                               (long)(int)l_1.
                                          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
        pvVar12 = std::vector<long_double,_std::allocator<long_double>_>::operator[]
                            (pvVar11,(long)i_7);
        lVar13 = *(longdouble *)pvVar12;
        pvVar9 = std::
                 vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                 ::operator[]((vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                               *)&i_5,(long)i_7);
        pvVar6 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[](pvVar9,0);
        pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](pvVar6,0);
        *pvVar8 = (double)((longdouble)*pvVar8 +
                          (longdouble)((dVar15 - dVar16) * (dVar17 - dVar4)) * lVar13);
        pvVar6 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               *)local_40,
                              (long)(int)l_1.
                                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
        pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](pvVar6,1);
        dVar15 = *pvVar8;
        pvVar6 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               *)&i_1,1);
        pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](pvVar6,(long)i_7);
        dVar16 = *pvVar8;
        pvVar6 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               *)local_40,
                              (long)(int)l_1.
                                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
        pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](pvVar6,1);
        dVar17 = *pvVar8;
        pvVar6 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               *)&i_1,1);
        pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](pvVar6,(long)i_7);
        dVar4 = *pvVar8;
        pvVar11 = std::
                  vector<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
                  ::operator[]((vector<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
                                *)local_158,
                               (long)(int)l_1.
                                          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
        pvVar12 = std::vector<long_double,_std::allocator<long_double>_>::operator[]
                            (pvVar11,(long)i_7);
        lVar13 = *(longdouble *)pvVar12;
        pvVar9 = std::
                 vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                 ::operator[]((vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                               *)&i_5,(long)i_7);
        pvVar6 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[](pvVar9,1);
        pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](pvVar6,1);
        *pvVar8 = (double)((longdouble)*pvVar8 +
                          (longdouble)((dVar15 - dVar16) * (dVar17 - dVar4)) * lVar13);
        in_ST5 = in_ST4;
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   *)&k_2);
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   *)local_3f0);
      }
      for (local_42c = 0; local_42c < cl; local_42c = local_42c + 1) {
        pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)local_220,(long)local_42c);
        dVar15 = *pvVar8;
        iVar5 = this->points_nmb;
        pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)&i_4,(long)local_42c);
        *pvVar8 = dVar15 / (double)iVar5;
      }
      pvVar9 = std::
               vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
               ::operator[]((vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                             *)&i_5,(long)i_7);
      pvVar6 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](pvVar9,0);
      pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](pvVar6,0);
      dVar15 = *pvVar8;
      pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)local_220,(long)i_7);
      dVar16 = *pvVar8;
      pvVar9 = std::
               vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
               ::operator[]((vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                             *)&i_3,(long)i_7);
      pvVar6 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](pvVar9,0);
      pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](pvVar6,0);
      *pvVar8 = dVar15 / dVar16;
      pvVar9 = std::
               vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
               ::operator[]((vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                             *)&i_5,(long)i_7);
      pvVar6 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](pvVar9,1);
      pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](pvVar6,1);
      dVar15 = *pvVar8;
      pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)local_220,(long)i_7);
      dVar16 = *pvVar8;
      pvVar9 = std::
               vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
               ::operator[]((vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                             *)&i_3,(long)i_7);
      pvVar6 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](pvVar9,1);
      pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](pvVar6,1);
      *pvVar8 = dVar15 / dVar16;
    }
    std::
    vector<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
    ::vector(&local_448,
             (vector<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
              *)local_158);
    make_clusters(this,&local_448,cl);
    std::
    vector<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
    ::~vector(&local_448);
    std::
    vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
    ::~vector((vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
               *)&i_5);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)local_220);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               *)local_1e0);
    dVar15 = extraout_XMM0_Qa_02;
  }
  std::
  vector<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
  ::~vector((vector<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
             *)local_158);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)&i_4);
  std::
  vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  ::~vector((vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
             *)&i_3);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)&i_1);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)local_40);
  return;
}

Assistant:

void EM:: em_alg(int cl) {
    int dim=2;
    double e=0.1;
    int Q=0;
    vector<vector<double>> Y(points_nmb);//xi
    for(int i=0;i<points_nmb;i++)//point_nmb*dim
    {
        Y[i].push_back(f.all_points[i].x);
        Y[i].push_back(f.all_points[i].y);
    }


    vector<vector<double>> C(dim);//mathematical expectation

    for(int i=0;i<cl;i++) {
        for (int i = 0; i < 2; i++) {
            C[i].resize(cl);

            for (int j = 0; j < cl; j++) {
                C[i][j] = (double)(rand() % 1000)/1000;

            }
        }
    }


    vector<vector<vector<double>>> R(cl);//sigma covariation matrix

    for(int i=0;i<cl;i++) {
        R[i].push_back({1,0});
        R[i].push_back({0,1});

    }


    vector<double> W(cl);

    for(int i=0;i<cl;i++) {
        W[i] = (double) 1 / cl;
    }


    vector<vector<long double>>X(points_nmb, vector<long double>(cl, 0));



    long double llh=0,llh2=e+2;
    long double sumpi=0;

    //start cycle
    while(fabs(llh2-llh)>=e and Q<50)
    {
        vector <vector <double> > Ctmp (dim, vector<double>(cl, 0));

        vector <double> Wtmp(cl, 0);

        Q++;
        llh=llh2;
        vector<vector<vector<double>>> Rtmp(cl);

        for(int i=0;i<cl;i++) {
            Rtmp[i].push_back({0,0});
            Rtmp[i].push_back({0,0});

        }

        llh2=0;
        for(int i=0;i<points_nmb;i++)
        {

            sumpi=0;
            for(int j=0;j<cl;j++)
            {
                vector<vector<double>> l(dim);

                for(int k=0;k<dim;k++)
                {
                    l[k].push_back(Y[i][k]-C[k][j]);

                }
                double sigma=matrix_composition(matrix_composition(matrix_transporation(l),matrix_reversal(R[j])),l)[0][0];//scalar product- mahalanobis distination
                X[i][j] = (long double)W[j] * expl((long double)-sigma/2)/sqrt(2*PI)/sqrt(determinat(R[j]));
                sumpi+=X[i][j];//found p(x)

            }
            for(int j=0;j<cl;j++) {
                X[i][j]/= sumpi;
                Wtmp[j]+=X[i][j];
                Ctmp[0][j]+= Y[i][0] * X[i][j];
                Ctmp[1][j]+=Y[i][1] * X[i][j];
            }

            llh2=llh2+log(sumpi);

        }

        for(int j=0;j<cl;j++)
        {
            for(int k=0;k<dim;k++)
            {
                C[k][j]=Ctmp[k][j]/Wtmp[j];
            }


            for(int i=0;i<points_nmb;i++)
            {
                vector<vector<double>> l(dim);
                vector<vector<double>> r(dim);
                for(int k=0;k<dim;k++)
                {
                    l[k].push_back((Y[i][k]-C[k][j])*X[i][j]);
                    r[k].push_back((Y[i][k]-C[k][j]));
                }

                Rtmp[j][0][0]+=(Y[i][0]-C[0][j])*(Y[i][0]-C[0][j])*X[i][j];
                Rtmp[j][1][1]+=(Y[i][1]-C[1][j])*(Y[i][1]-C[1][j])*X[i][j];
            }
            for (int i = 0; i < cl; i++) {
                W[i] = Wtmp[i]/points_nmb;
            }
            R[j][0][0] = Rtmp[j][0][0]/Wtmp[j];
            R[j][1][1] = Rtmp[j][1][1]/Wtmp[j];

        }
        make_clusters(X,cl);


    }



}